

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

void N_VScale_Serial(realtype c,N_Vector x,N_Vector z)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  realtype *xd;
  realtype *zd;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (z == x) {
    lVar3 = (long)*x->content;
    if (0 < lVar3) {
      lVar2 = *(long *)((long)x->content + 8);
      lVar4 = 0;
      do {
        *(double *)(lVar2 + lVar4 * 8) = *(double *)(lVar2 + lVar4 * 8) * c;
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
  }
  else if ((c != 1.0) || (NAN(c))) {
    uVar1 = *x->content;
    lVar3 = *(long *)((long)x->content + 8);
    lVar2 = *(long *)((long)z->content + 8);
    if ((c != -1.0) || (NAN(c))) {
      if (0 < (int)uVar1) {
        uVar6 = 0;
        do {
          *(double *)(lVar2 + uVar6 * 8) = *(double *)(lVar3 + uVar6 * 8) * c;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
    }
    else if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        *(ulong *)(lVar2 + uVar6 * 8) = *(ulong *)(lVar3 + uVar6 * 8) ^ 0x8000000000000000;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  else {
    lVar3 = (long)*x->content;
    if (0 < lVar3) {
      lVar2 = *(long *)((long)x->content + 8);
      lVar4 = *(long *)((long)z->content + 8);
      lVar5 = 0;
      do {
        *(undefined8 *)(lVar4 + lVar5 * 8) = *(undefined8 *)(lVar2 + lVar5 * 8);
        lVar5 = lVar5 + 1;
      } while (lVar3 != lVar5);
    }
  }
  return;
}

Assistant:

void N_VScale_Serial(realtype c, N_Vector x, N_Vector z)
{
  sunindextype i, N;
  realtype *xd, *zd;

  xd = zd = NULL;

  if (z == x) {  /* BLAS usage: scale x <- cx */
    VScaleBy_Serial(c, x);
    return;
  }

  if (c == ONE) {
    VCopy_Serial(x, z);
  } else if (c == -ONE) {
    VNeg_Serial(x, z);
  } else {
    N  = NV_LENGTH_S(x);
    xd = NV_DATA_S(x);
    zd = NV_DATA_S(z);
    for (i = 0; i < N; i++)
      zd[i] = c*xd[i];
  }

  return;
}